

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

GatherAlongAxisLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_gatheralongaxis(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x3b8) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x3b8;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x20);
    GatherAlongAxisLayerParams::GatherAlongAxisLayerParams(this_00.gatheralongaxis_);
    (this->layer_).gatheralongaxis_ = (GatherAlongAxisLayerParams *)this_00;
  }
  return (GatherAlongAxisLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::GatherAlongAxisLayerParams* NeuralNetworkLayer::mutable_gatheralongaxis() {
  if (!has_gatheralongaxis()) {
    clear_layer();
    set_has_gatheralongaxis();
    layer_.gatheralongaxis_ = new ::CoreML::Specification::GatherAlongAxisLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.gatherAlongAxis)
  return layer_.gatheralongaxis_;
}